

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *field)

{
  size_t *psVar1;
  pointer *pppIVar2;
  ImportModuleField *pIVar3;
  iterator __position;
  ModuleField *pMVar4;
  ModuleFieldList *pMVar5;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *p_Var6;
  int iVar7;
  Func *pFVar8;
  Import *import;
  _Head_base<0UL,_wabt::Import_*,_false> local_60;
  Func *local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  
  local_60._M_head_impl =
       *(Import **)
        &(((field->_M_t).
           super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import)._M_t.
         super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>;
  switch((local_60._M_head_impl)->kind_) {
  case First:
    pFVar8 = (Func *)(local_60._M_head_impl + 1);
    p_Var6 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->func_bindings;
    iVar7 = (int)((ulong)((long)(this->funcs).
                                super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->funcs).
                               super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_58 = pFVar8;
    std::vector<wabt::Func*,std::allocator<wabt::Func*>>::emplace_back<wabt::Func*>
              ((vector<wabt::Func*,std::allocator<wabt::Func*>> *)&this->funcs,&local_58);
    this->num_func_imports = this->num_func_imports + 1;
    break;
  case Table:
    pFVar8 = (Func *)(local_60._M_head_impl + 1);
    p_Var6 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->table_bindings;
    iVar7 = (int)((ulong)((long)(this->tables).
                                super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->tables).
                               super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_58 = pFVar8;
    std::vector<wabt::Table*,std::allocator<wabt::Table*>>::emplace_back<wabt::Table*>
              ((vector<wabt::Table*,std::allocator<wabt::Table*>> *)&this->tables,
               (Table **)&local_58);
    this->num_table_imports = this->num_table_imports + 1;
    break;
  case Memory:
    pFVar8 = (Func *)(local_60._M_head_impl + 1);
    p_Var6 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->memory_bindings;
    iVar7 = (int)((ulong)((long)(this->memories).
                                super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->memories).
                               super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_58 = pFVar8;
    std::vector<wabt::Memory*,std::allocator<wabt::Memory*>>::emplace_back<wabt::Memory*>
              ((vector<wabt::Memory*,std::allocator<wabt::Memory*>> *)&this->memories,
               (Memory **)&local_58);
    this->num_memory_imports = this->num_memory_imports + 1;
    break;
  case Global:
    pFVar8 = (Func *)(local_60._M_head_impl + 1);
    p_Var6 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->global_bindings;
    iVar7 = (int)((ulong)((long)(this->globals).
                                super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->globals).
                               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_58 = pFVar8;
    std::vector<wabt::Global*,std::allocator<wabt::Global*>>::emplace_back<wabt::Global*>
              ((vector<wabt::Global*,std::allocator<wabt::Global*>> *)&this->globals,
               (Global **)&local_58);
    this->num_global_imports = this->num_global_imports + 1;
    break;
  case Last:
    pFVar8 = (Func *)(local_60._M_head_impl + 1);
    p_Var6 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->tag_bindings;
    iVar7 = (int)((ulong)((long)(this->tags).
                                super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->tags).
                               super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3);
    local_58 = pFVar8;
    std::vector<wabt::Tag*,std::allocator<wabt::Tag*>>::emplace_back<wabt::Tag*>
              ((vector<wabt::Tag*,std::allocator<wabt::Tag*>> *)&this->tags,(Tag **)&local_58);
    this->num_tag_imports = this->num_tag_imports + 1;
    break;
  default:
    iVar7 = -1;
    p_Var6 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)0x0;
    pFVar8 = (Func *)0x0;
  }
  if (((iVar7 == -1) || (pFVar8 == (Func *)0x0)) ||
     (p_Var6 == (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                 *)0x0)) {
    __assert_fail("name && bindings && index != kInvalidIndex",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/ir.cc",
                  0x1d4,"void wabt::Module::AppendField(std::unique_ptr<ImportModuleField>)");
  }
  if ((((string *)&(pFVar8->name)._M_string_length)->_M_dataplus)._M_p != (pointer)0x0) {
    pIVar3 = (field->_M_t).
             super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
    local_58 = (Func *)(((Location *)
                        ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                                super_ModuleField + 0x18))->filename)._M_len;
    uStack_50 = *(undefined4 *)
                 ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                         super_ModuleField + 0x20);
    uStack_4c = *(undefined4 *)
                 ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                         super_ModuleField + 0x24);
    local_48 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
                + 0x28))->field_0).line;
    uStack_44 = *(undefined4 *)
                 ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                         super_ModuleField + 0x2c);
    uStack_40 = *(undefined4 *)
                 ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                         super_ModuleField + 0x30);
    uStack_3c = *(undefined4 *)
                 ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                         super_ModuleField + 0x34);
    local_38 = iVar7;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string_const&,wabt::Binding>(p_Var6,0,pFVar8);
  }
  __position._M_current =
       (this->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::Import*,std::allocator<wabt::Import*>>::_M_realloc_insert<wabt::Import*const&>
              ((vector<wabt::Import*,std::allocator<wabt::Import*>> *)&this->imports,__position,
               &local_60._M_head_impl);
  }
  else {
    *__position._M_current = local_60._M_head_impl;
    pppIVar2 = &(this->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar2 = *pppIVar2 + 1;
  }
  pIVar3 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
  super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl = (ImportModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar4 = (this->fields).last_;
    if (pMVar4 == (ModuleField *)0x0) {
      pMVar5 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pIVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField + 0x10)
           = pMVar4;
      pMVar5 = (ModuleFieldList *)&pMVar4->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar5->first_ = (ModuleField *)pIVar3;
    (this->fields).last_ = (ModuleField *)pIVar3;
    psVar1 = &(this->fields).size_;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<ImportModuleField> field) {
  Import* import = field->import.get();
  const std::string* name = nullptr;
  BindingHash* bindings = nullptr;
  Index index = kInvalidIndex;

  switch (import->kind()) {
    case ExternalKind::Func: {
      Func& func = cast<FuncImport>(import)->func;
      name = &func.name;
      bindings = &func_bindings;
      index = funcs.size();
      funcs.push_back(&func);
      ++num_func_imports;
      break;
    }

    case ExternalKind::Table: {
      Table& table = cast<TableImport>(import)->table;
      name = &table.name;
      bindings = &table_bindings;
      index = tables.size();
      tables.push_back(&table);
      ++num_table_imports;
      break;
    }

    case ExternalKind::Memory: {
      Memory& memory = cast<MemoryImport>(import)->memory;
      name = &memory.name;
      bindings = &memory_bindings;
      index = memories.size();
      memories.push_back(&memory);
      ++num_memory_imports;
      break;
    }

    case ExternalKind::Global: {
      Global& global = cast<GlobalImport>(import)->global;
      name = &global.name;
      bindings = &global_bindings;
      index = globals.size();
      globals.push_back(&global);
      ++num_global_imports;
      break;
    }

    case ExternalKind::Tag: {
      Tag& tag = cast<TagImport>(import)->tag;
      name = &tag.name;
      bindings = &tag_bindings;
      index = tags.size();
      tags.push_back(&tag);
      ++num_tag_imports;
      break;
    }
  }

  assert(name && bindings && index != kInvalidIndex);
  if (!name->empty()) {
    bindings->emplace(*name, Binding(field->loc, index));
  }
  imports.push_back(import);
  fields.push_back(std::move(field));
}